

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_client.hpp
# Opt level: O0

void __thiscall rest_rpc::rpc_client::send_subscribe(rpc_client *this,string *key,string *token)

{
  rpc_client *in_RDI;
  buffer_type ret;
  msgpack_codec codec;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  undefined1 local_50 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc8;
  
  rpc_service::msgpack_codec::msgpack_codec((msgpack_codec *)0x272d67);
  rpc_service::msgpack_codec::pack_args<std::__cxx11::string_const&,std::__cxx11::string_const&>
            (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  std::__cxx11::string::data();
  MD5::MD5Hash32((char *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
  write(in_RDI,0,(void *)0x1,(size_t)local_50);
  msgpack::v1::sbuffer::~sbuffer((sbuffer *)0x272dbe);
  rpc_service::msgpack_codec::~msgpack_codec((msgpack_codec *)0x272dc8);
  return;
}

Assistant:

void send_subscribe(const std::string &key, const std::string &token) {
    rpc_service::msgpack_codec codec;
    auto ret = codec.pack_args(key, token);
    write(0, request_type::sub_pub, std::move(ret), MD5::MD5Hash32(key.data()));
  }